

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_binder.cpp
# Opt level: O3

LogicalType *
duckdb::ExpressionBinder::ExchangeType
          (LogicalType *__return_storage_ptr__,LogicalType *type,LogicalTypeId target,
          LogicalType *new_type)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *__x;
  LogicalType *pLVar2;
  idx_t index;
  undefined7 in_register_00000011;
  child_list_t<LogicalType> *__range3;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *this;
  element_type *peVar3;
  element_type *peVar4;
  child_list_t<LogicalType> child_types;
  LogicalType local_118;
  LogicalType *local_100;
  LogicalType local_f8;
  optional_idx local_e0;
  child_list_t<LogicalType> local_d8;
  LogicalType local_c0;
  LogicalType local_a8;
  LogicalType local_90;
  child_list_t<LogicalType> local_78;
  LogicalType local_60;
  LogicalType local_48;
  
  if (type->id_ == target) {
    LogicalType::LogicalType(__return_storage_ptr__,new_type);
    return __return_storage_ptr__;
  }
  local_100 = __return_storage_ptr__;
  switch(type->id_) {
  case STRUCT:
    __x = &StructType::GetChildTypes_abi_cxx11_(type)->
           super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ;
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_118,__x);
    peVar4 = local_118.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((element_type *)local_118._0_8_ !=
        local_118.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
      pLVar2 = (LogicalType *)
               ((long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(local_118._0_8_ + 0x10))->_M_local_buf + 0x10);
      do {
        LogicalType::LogicalType(&local_48,new_type);
        ExchangeType(&local_f8,pLVar2,target,&local_48);
        pLVar2->id_ = local_f8.id_;
        pLVar2->physical_type_ = local_f8.physical_type_;
        peVar3 = (pLVar2->type_info_).internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var1 = (pLVar2->type_info_).internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        (pLVar2->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_f8.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (pLVar2->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             local_f8.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        local_f8.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
        local_f8.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             p_Var1;
        LogicalType::~LogicalType(&local_f8);
        LogicalType::~LogicalType(&local_48);
        peVar3 = (element_type *)(pLVar2 + 1);
        pLVar2 = (LogicalType *)&pLVar2[2].type_info_;
      } while (peVar3 != peVar4);
    }
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_d8,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_118);
    pLVar2 = local_100;
    LogicalType::STRUCT(local_100,&local_d8);
    this = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            *)&local_d8;
    goto LAB_01212529;
  case LIST:
    pLVar2 = ListType::GetChildType(type);
    LogicalType::LogicalType(&local_90,new_type);
    ExchangeType(&local_118,pLVar2,target,&local_90);
    LogicalType::LIST(__return_storage_ptr__,&local_118);
    LogicalType::~LogicalType(&local_118);
    pLVar2 = &local_90;
    break;
  case MAP:
    pLVar2 = ListType::GetChildType(type);
    LogicalType::LogicalType(&local_a8,new_type);
    ExchangeType(&local_118,pLVar2,target,&local_a8);
    LogicalType::MAP(__return_storage_ptr__,&local_118);
    LogicalType::~LogicalType(&local_118);
    pLVar2 = &local_a8;
    break;
  default:
    LogicalType::LogicalType(__return_storage_ptr__,type);
    return __return_storage_ptr__;
  case UNION:
    UnionType::CopyMemberTypes_abi_cxx11_
              ((child_list_t<LogicalType> *)&local_118,(UnionType *)type,
               (LogicalType *)CONCAT71(in_register_00000011,target));
    if ((element_type *)local_118._0_8_ !=
        local_118.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
      pLVar2 = (LogicalType *)
               ((long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(local_118._0_8_ + 0x10))->_M_local_buf + 0x10);
      do {
        LogicalType::LogicalType(&local_60,new_type);
        ExchangeType(&local_f8,pLVar2,target,&local_60);
        pLVar2->id_ = local_f8.id_;
        pLVar2->physical_type_ = local_f8.physical_type_;
        peVar4 = (pLVar2->type_info_).internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var1 = (pLVar2->type_info_).internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        (pLVar2->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_f8.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (pLVar2->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             local_f8.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        local_f8.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
        local_f8.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             p_Var1;
        LogicalType::~LogicalType(&local_f8);
        LogicalType::~LogicalType(&local_60);
        peVar4 = (element_type *)(pLVar2 + 1);
        pLVar2 = (LogicalType *)&pLVar2[2].type_info_;
      } while (peVar4 != local_118.type_info_.internal.
                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
    }
    pLVar2 = local_100;
    local_78.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_118.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    local_118._0_8_ = (element_type *)0x0;
    local_118.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_118.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    LogicalType::UNION(local_100,&local_78);
    this = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            *)&local_78;
LAB_01212529:
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::~vector(this);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_118);
    return pLVar2;
  case ARRAY:
    pLVar2 = ArrayType::GetChildType(type);
    LogicalType::LogicalType(&local_c0,new_type);
    ExchangeType(&local_118,pLVar2,target,&local_c0);
    index = ArrayType::GetSize(type);
    optional_idx::optional_idx(&local_e0,index);
    LogicalType::ARRAY(__return_storage_ptr__,&local_118,local_e0);
    LogicalType::~LogicalType(&local_118);
    pLVar2 = &local_c0;
  }
  LogicalType::~LogicalType(pLVar2);
  return __return_storage_ptr__;
}

Assistant:

LogicalType ExpressionBinder::ExchangeType(const LogicalType &type, LogicalTypeId target, LogicalType new_type) {
	if (type.id() == target) {
		return new_type;
	}
	switch (type.id()) {
	case LogicalTypeId::STRUCT: {
		// we make a copy of the child types of the struct here
		auto child_types = StructType::GetChildTypes(type);
		for (auto &child_type : child_types) {
			child_type.second = ExchangeType(child_type.second, target, new_type);
		}
		return LogicalType::STRUCT(child_types);
	}
	case LogicalTypeId::UNION: {
		auto member_types = UnionType::CopyMemberTypes(type);
		for (auto &member_type : member_types) {
			member_type.second = ExchangeType(member_type.second, target, new_type);
		}
		return LogicalType::UNION(std::move(member_types));
	}
	case LogicalTypeId::LIST:
		return LogicalType::LIST(ExchangeType(ListType::GetChildType(type), target, new_type));
	case LogicalTypeId::MAP:
		return LogicalType::MAP(ExchangeType(ListType::GetChildType(type), target, new_type));
	case LogicalTypeId::ARRAY:
		return LogicalType::ARRAY(ExchangeType(ArrayType::GetChildType(type), target, new_type),
		                          ArrayType::GetSize(type));
	default:
		return type;
	}
}